

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::
         format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
                   (char *fmt,basic_string_view<char,_std::char_traits<char>_> *args,
                   basic_string_view<char,_std::char_traits<char>_> *args_1,int *args_2,
                   basic_string_view<char,_std::char_traits<char>_> *args_3,char (*args_4) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [42])

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe18;
  string *args_1_00;
  basic_string_view<char,_std::char_traits<char>_> *args_00;
  char *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> local_188 [9];
  char (*in_stack_ffffffffffffff10) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff20) [42];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_188;
  args_1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_00);
  format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,args_00,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1_00,(int *)in_RDI,
             in_stack_fffffffffffffe18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_1_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}